

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void P_SpawnSpecials(void)

{
  int plane;
  uint plane_00;
  bool bVar1;
  int iVar2;
  ASkyViewpoint *origin;
  DLightTransfer *pDVar3;
  DWallLightTransfer *this;
  long lVar4;
  sector_t_conflict *psVar5;
  double dVar6;
  FSectorTagIterator local_d8;
  FSectorTagIterator itr_3;
  sector_t *sec;
  FSectorTagIterator itr_2;
  int damage;
  FSectorTagIterator itr_1;
  double grav;
  uint local_74;
  side_t *psStack_70;
  uint pnum;
  line_t_conflict *line;
  undefined1 local_58 [16];
  FSectorTagIterator itr;
  ASkyCamCompat *pt2;
  TThinkerIterator<ASkyCamCompat> it2;
  sector_t_conflict *psStack_10;
  int i;
  sector_t *sector;
  
  P_SetupPortals();
  psStack_10 = sectors;
  for (it2.super_FThinkerIterator._20_4_ = 0; (int)it2.super_FThinkerIterator._20_4_ < numsectors;
      it2.super_FThinkerIterator._20_4_ = it2.super_FThinkerIterator._20_4_ + 1) {
    if (psStack_10->special != 0) {
      P_InitSectorSpecial((sector_t *)psStack_10,(int)psStack_10->special);
    }
    psStack_10 = psStack_10 + 1;
  }
  ProcessEDSectors();
  P_SpawnScrollers();
  P_SpawnFriction();
  P_SpawnPushers();
  TThinkerIterator<ASkyCamCompat>::TThinkerIterator((TThinkerIterator<ASkyCamCompat> *)&pt2,0x80);
  while( true ) {
    psVar5 = (sector_t_conflict *)0x0;
    origin = &TThinkerIterator<ASkyCamCompat>::Next((TThinkerIterator<ASkyCamCompat> *)&pt2,false)->
              super_ASkyViewpoint;
    if (origin == (ASkyViewpoint *)0x0) break;
    P_SpawnSkybox(origin);
  }
  for (it2.super_FThinkerIterator._20_4_ = 0; (int)it2.super_FThinkerIterator._20_4_ < numlines;
      it2.super_FThinkerIterator._20_4_ = it2.super_FThinkerIterator._20_4_ + 1) {
    iVar2 = lines[(int)it2.super_FThinkerIterator._20_4_].special;
    if (iVar2 == 0x10) {
      this = (DWallLightTransfer *)DObject::operator_new((DObject *)0x48,(size_t)psVar5);
      lVar4 = (long)(int)it2.super_FThinkerIterator._20_4_;
      psVar5 = lines[lVar4].frontsector;
      DWallLightTransfer::DWallLightTransfer
                (this,(sector_t *)psVar5,lines[lVar4].args[0],(BYTE)lines[lVar4].args[1]);
    }
    else if (iVar2 == 0x30) {
      psVar5 = (sector_t_conflict *)
               (ulong)(uint)lines[(int)it2.super_FThinkerIterator._20_4_].args[0];
      P_Attach3dMidtexLinesToSector
                (lines[(int)it2.super_FThinkerIterator._20_4_].frontsector,
                 lines[(int)it2.super_FThinkerIterator._20_4_].args[0],
                 lines[(int)it2.super_FThinkerIterator._20_4_].args[1],
                 lines[(int)it2.super_FThinkerIterator._20_4_].args[2] != 0);
    }
    else if (iVar2 == 0x33) {
      if (lines[(int)it2.super_FThinkerIterator._20_4_].args[0] == 0) {
        psVar5 = (sector_t_conflict *)
                 (ulong)(uint)lines[(int)it2.super_FThinkerIterator._20_4_].args[1];
        P_AddSectorLinks(lines[(int)it2.super_FThinkerIterator._20_4_].frontsector,
                         lines[(int)it2.super_FThinkerIterator._20_4_].args[1],
                         lines[(int)it2.super_FThinkerIterator._20_4_].args[2],
                         lines[(int)it2.super_FThinkerIterator._20_4_].args[3]);
      }
    }
    else if (iVar2 == 0x39) {
      if (((lines[(int)it2.super_FThinkerIterator._20_4_].args[1] == 0) ||
          (lines[(int)it2.super_FThinkerIterator._20_4_].args[1] == 6)) &&
         (lines[(int)it2.super_FThinkerIterator._20_4_].args[3] == 0)) {
        psVar5 = (sector_t_conflict *)
                 (ulong)(uint)lines[(int)it2.super_FThinkerIterator._20_4_].args[0];
        P_SpawnPortal(lines + (int)it2.super_FThinkerIterator._20_4_,
                      lines[(int)it2.super_FThinkerIterator._20_4_].args[0],
                      lines[(int)it2.super_FThinkerIterator._20_4_].args[2],
                      lines[(int)it2.super_FThinkerIterator._20_4_].args[4],
                      lines[(int)it2.super_FThinkerIterator._20_4_].args[1]);
      }
      else if ((lines[(int)it2.super_FThinkerIterator._20_4_].args[1] == 3) ||
              (lines[(int)it2.super_FThinkerIterator._20_4_].args[1] == 4)) {
        psStack_70 = (side_t *)(lines + (int)it2.super_FThinkerIterator._20_4_);
        iVar2 = 5;
        if (psStack_70->textures[0].texture.texnum == 3) {
          iVar2 = 4;
        }
        plane = *(int *)&psStack_70->textures[0].field_0x24;
        psVar5 = (sector_t_conflict *)psStack_70->textures[2].yOffset;
        TVector2<double>::TVector2((TVector2<double> *)&grav,0.0,0.0);
        local_74 = P_GetPortal(iVar2,plane,psVar5,(sector_t_conflict *)0x0,(DVector2 *)&grav);
        plane_00 = *(uint *)&psStack_70->textures[0].field_0x24;
        psVar5 = (sector_t_conflict *)(ulong)plane_00;
        CopyPortal(*(int *)((long)&psStack_70->textures[0].yScale + 4),plane_00,local_74,0.0,true);
      }
    }
    else if (iVar2 == 0x9c) {
      P_SpawnLinePortal(lines + (int)it2.super_FThinkerIterator._20_4_);
    }
    else if (iVar2 == 0xbe) {
      iVar2 = lines[(int)it2.super_FThinkerIterator._20_4_].args[1];
      if (iVar2 == 0) {
        line_t::Delta((line_t *)&itr_1);
        dVar6 = TVector2<double>::Length((TVector2<double> *)&itr_1);
        psVar5 = (sector_t_conflict *)
                 (ulong)(uint)lines[(int)it2.super_FThinkerIterator._20_4_].args[0];
        FSectorTagIterator::FSectorTagIterator
                  ((FSectorTagIterator *)&stack0xffffffffffffff58,
                   lines[(int)it2.super_FThinkerIterator._20_4_].args[0]);
        while (iVar2 = FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffff58),
              -1 < iVar2) {
          sectors[iVar2].gravity = dVar6 / 100.0;
        }
      }
      else if (iVar2 == 2) {
        line_t::Delta((line_t *)&itr_2);
        dVar6 = TVector2<double>::Length((TVector2<double> *)&itr_2);
        psVar5 = (sector_t_conflict *)
                 (ulong)(uint)lines[(int)it2.super_FThinkerIterator._20_4_].args[0];
        FSectorTagIterator::FSectorTagIterator
                  ((FSectorTagIterator *)&sec,lines[(int)it2.super_FThinkerIterator._20_4_].args[0])
        ;
        while (iVar2 = FSectorTagIterator::Next((FSectorTagIterator *)&sec), -1 < iVar2) {
          itr_3 = (FSectorTagIterator)(sectors + iVar2);
          *(int *)((long)itr_3 + 0x1e4) = (int)dVar6;
          psVar5 = (sector_t_conflict *)0x0;
          FNameNoInit::operator=((FNameNoInit *)((long)itr_3 + 0x1e0),NAME_None);
          if (*(int *)((long)itr_3 + 0x1e4) < 0x14) {
            *(undefined2 *)((long)itr_3 + 0x1ea) = 0;
            *(undefined2 *)((long)itr_3 + 0x1e8) = 0x20;
          }
          else if (*(int *)((long)itr_3 + 0x1e4) < 0x32) {
            *(undefined2 *)((long)itr_3 + 0x1ea) = 5;
            *(undefined2 *)((long)itr_3 + 0x1e8) = 0x20;
          }
          else {
            *(undefined2 *)((long)itr_3 + 0x1ea) = 0x100;
            *(undefined2 *)((long)itr_3 + 0x1e8) = 1;
          }
        }
      }
      else if (iVar2 == 3) {
        if (lines[(int)it2.super_FThinkerIterator._20_4_].args[3] == 0) {
          psVar5 = (sector_t_conflict *)
                   (ulong)(uint)lines[(int)it2.super_FThinkerIterator._20_4_].args[0];
          P_AddSectorLinksByID
                    (lines[(int)it2.super_FThinkerIterator._20_4_].frontsector,
                     lines[(int)it2.super_FThinkerIterator._20_4_].args[0],
                     lines[(int)it2.super_FThinkerIterator._20_4_].args[2]);
        }
      }
      else if (iVar2 == 0xff) {
        psVar5 = (sector_t_conflict *)
                 (ulong)(uint)lines[(int)it2.super_FThinkerIterator._20_4_].args[0];
        FSectorTagIterator::FSectorTagIterator
                  (&local_d8,lines[(int)it2.super_FThinkerIterator._20_4_].args[0]);
        while (iVar2 = FSectorTagIterator::Next(&local_d8), -1 < iVar2) {
          sectors[iVar2].sky = it2.super_FThinkerIterator._20_4_ + 1 | 0x40000000;
        }
      }
    }
    else if (iVar2 == 0xd1) {
      itr = (FSectorTagIterator)lines[(int)it2.super_FThinkerIterator._20_4_].frontsector;
      if ((lines[(int)it2.super_FThinkerIterator._20_4_].args[1] & 2U) != 0) {
        *(WORD *)((long)itr + 0x1ee) = *(WORD *)((long)itr + 0x1ee) | 2;
      }
      if ((lines[(int)it2.super_FThinkerIterator._20_4_].args[1] & 4U) != 0) {
        *(WORD *)((long)itr + 0x1ee) = *(WORD *)((long)itr + 0x1ee) | 4;
      }
      if ((lines[(int)it2.super_FThinkerIterator._20_4_].args[1] & 8U) == 0) {
        bVar1 = FBoolCVar::operator_cast_to_bool(&forcewater);
        if (bVar1) {
          *(ushort *)((long)itr + 0x1ee) = *(ushort *)((long)itr + 0x1ee) | 0x40;
        }
      }
      else {
        *(WORD *)((long)itr + 0x1ee) = *(WORD *)((long)itr + 0x1ee) | 0x20;
      }
      if ((lines[(int)it2.super_FThinkerIterator._20_4_].args[1] & 0x10U) != 0) {
        *(ushort *)((long)itr + 0x1ee) = *(ushort *)((long)itr + 0x1ee) | 0x10;
      }
      if ((lines[(int)it2.super_FThinkerIterator._20_4_].args[1] & 0x20U) != 0) {
        *(ushort *)((long)itr + 0x1ee) = *(ushort *)((long)itr + 0x1ee) | 8;
      }
      psVar5 = (sector_t_conflict *)
               (ulong)(uint)lines[(int)it2.super_FThinkerIterator._20_4_].args[0];
      FSectorTagIterator::FSectorTagIterator
                ((FSectorTagIterator *)(local_58 + 8),
                 lines[(int)it2.super_FThinkerIterator._20_4_].args[0]);
      while (iVar2 = FSectorTagIterator::Next((FSectorTagIterator *)(local_58 + 8)), -1 < iVar2) {
        sectors[iVar2].heightsec = (sector_t_conflict *)itr;
        local_58._0_8_ = sectors + iVar2;
        psVar5 = (sector_t_conflict *)local_58;
        TArray<sector_t_*,_sector_t_*>::Push
                  (*(TArray<sector_t_*,_sector_t_*> **)((long)itr + 0x210),
                   (sector_t_conflict **)psVar5);
        sector_t::AdjustFloorClip((sector_t *)(sectors + iVar2));
      }
    }
    else if (iVar2 == 0xd2) {
      pDVar3 = (DLightTransfer *)DObject::operator_new((DObject *)0x48,(size_t)psVar5);
      psVar5 = lines[(int)it2.super_FThinkerIterator._20_4_].frontsector;
      DLightTransfer::DLightTransfer
                (pDVar3,(sector_t *)psVar5,lines[(int)it2.super_FThinkerIterator._20_4_].args[0],
                 true);
    }
    else if (iVar2 == 0xd3) {
      pDVar3 = (DLightTransfer *)DObject::operator_new((DObject *)0x48,(size_t)psVar5);
      psVar5 = lines[(int)it2.super_FThinkerIterator._20_4_].frontsector;
      DLightTransfer::DLightTransfer
                (pDVar3,(sector_t *)psVar5,lines[(int)it2.super_FThinkerIterator._20_4_].args[0],
                 false);
    }
  }
  FBehavior::StaticStartTypedScripts(1,(AActor *)0x0,false,0,false);
  return;
}

Assistant:

void P_SpawnSpecials (void)
{
	sector_t *sector;
	int i;

	P_SetupPortals();

	//	Init special SECTORs.
	sector = sectors;
	for (i = 0; i < numsectors; i++, sector++)
	{
		if (sector->special == 0)
			continue;

		P_InitSectorSpecial(sector, sector->special);
	}

#ifndef NO_EDATA
	ProcessEDSectors();
#endif

	
	// Init other misc stuff

	P_SpawnScrollers(); // killough 3/7/98: Add generalized scrollers
	P_SpawnFriction();	// phares 3/12/98: New friction model using linedefs
	P_SpawnPushers();	// phares 3/20/98: New pusher model using linedefs

	TThinkerIterator<ASkyCamCompat> it2;
	ASkyCamCompat *pt2;
	while ((pt2 = it2.Next()))
	{
		P_SpawnSkybox(pt2);
	}

	for (i = 0; i < numlines; i++)
	{
		switch (lines[i].special)
		{
			int s;
			sector_t *sec;

		// killough 3/7/98:
		// support for drawn heights coming from different sector
		case Transfer_Heights:
			{
				sec = lines[i].frontsector;
				if (lines[i].args[1] & 2)
				{
					sec->MoreFlags |= SECF_FAKEFLOORONLY;
				}
				if (lines[i].args[1] & 4)
				{
					sec->MoreFlags |= SECF_CLIPFAKEPLANES;
				}
				if (lines[i].args[1] & 8)
				{
					sec->MoreFlags |= SECF_UNDERWATER;
				}
				else if (forcewater)
				{
					sec->MoreFlags |= SECF_FORCEDUNDERWATER;
				}
				if (lines[i].args[1] & 16)
				{
					sec->MoreFlags |= SECF_IGNOREHEIGHTSEC;
				}
				if (lines[i].args[1] & 32)
				{
					sec->MoreFlags |= SECF_NOFAKELIGHT;
				}
				FSectorTagIterator itr(lines[i].args[0]);
				while ((s = itr.Next()) >= 0)
				{
					sectors[s].heightsec = sec;
					sec->e->FakeFloor.Sectors.Push(&sectors[s]);
					sectors[s].AdjustFloorClip();
				}
				break;
			}

		// killough 3/16/98: Add support for setting
		// floor lighting independently (e.g. lava)
		case Transfer_FloorLight:
			new DLightTransfer (lines[i].frontsector, lines[i].args[0], true);
			break;

		// killough 4/11/98: Add support for setting
		// ceiling lighting independently
		case Transfer_CeilingLight:
			new DLightTransfer (lines[i].frontsector, lines[i].args[0], false);
			break;

		// [Graf Zahl] Add support for setting lighting
		// per wall independently
		case Transfer_WallLight:
			new DWallLightTransfer (lines[i].frontsector, lines[i].args[0], lines[i].args[1]);
			break;

		case Sector_Attach3dMidtex:
			P_Attach3dMidtexLinesToSector(lines[i].frontsector, lines[i].args[0], lines[i].args[1], !!lines[i].args[2]);
			break;

		case Sector_SetLink:
			if (lines[i].args[0] == 0)
			{
				P_AddSectorLinks(lines[i].frontsector, lines[i].args[1], lines[i].args[2], lines[i].args[3]);
			}
			break;

		case Sector_SetPortal:
			// arg 0 = sector tag
			// arg 1 = type
			//	- 0: normal (handled here)
			//	- 1: copy (handled by the portal they copy)
			//	- 2: EE-style skybox (handled by the camera object)
			//  - 3: EE-style flat portal (GZDoom HW renderer only for now)
			//  - 4: EE-style horizon portal (GZDoom HW renderer only for now)
			//  - 5: copy portal to line (GZDoom HW renderer only for now)
			//  - 6: linked portal
			//	other values reserved for later use
			// arg 2 = 0:floor, 1:ceiling, 2:both
			// arg 3 = 0: anchor, 1: reference line
			// arg 4 = for the anchor only: alpha
			if ((lines[i].args[1] == 0 || lines[i].args[1] == 6) && lines[i].args[3] == 0)
			{
				P_SpawnPortal(&lines[i], lines[i].args[0], lines[i].args[2], lines[i].args[4], lines[i].args[1]);
			}
			else if (lines[i].args[1] == 3 || lines[i].args[1] == 4)
			{
				line_t *line = &lines[i];
				unsigned pnum = P_GetPortal(line->args[1] == 3 ? PORTS_PLANE : PORTS_HORIZON, line->args[2], line->frontsector, NULL, { 0,0 });
				CopyPortal(line->args[0], line->args[2], pnum, 0, true);
			}
			break;

		case Line_SetPortal:
			P_SpawnLinePortal(&lines[i]);
			break;

		// [RH] ZDoom Static_Init settings
		case Static_Init:
			switch (lines[i].args[1])
			{
			case Init_Gravity:
				{
					double grav = lines[i].Delta().Length() / 100.;
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
						sectors[s].gravity = grav;
				}
				break;

			//case Init_Color:
			// handled in P_LoadSideDefs2()

			case Init_Damage:
				{
					int damage = int(lines[i].Delta().Length());
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
					{
						sector_t *sec = &sectors[s];
						sec->damageamount = damage;
						sec->damagetype = NAME_None;
						if (sec->damageamount < 20)
						{
							sec->leakydamage = 0;
							sec->damageinterval = 32;
						}
						else if (sec->damageamount < 50)
						{
							sec->leakydamage = 5;
							sec->damageinterval = 32;
						}
						else
						{
							sec->leakydamage = 256;
							sec->damageinterval = 1;
						}
					}
				}
				break;

			case Init_SectorLink:
				if (lines[i].args[3] == 0)
					P_AddSectorLinksByID(lines[i].frontsector, lines[i].args[0], lines[i].args[2]);
				break;

			// killough 10/98:
			//
			// Support for sky textures being transferred from sidedefs.
			// Allows scrolling and other effects (but if scrolling is
			// used, then the same sector tag needs to be used for the
			// sky sector, the sky-transfer linedef, and the scroll-effect
			// linedef). Still requires user to use F_SKY1 for the floor
			// or ceiling texture, to distinguish floor and ceiling sky.

			case Init_TransferSky:
				{
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
						 sectors[s].sky = (i + 1) | PL_SKYFLAT; 
					break;
				}
			}
			break;
		}
	}
	// [RH] Start running any open scripts on this map
	FBehavior::StaticStartTypedScripts (SCRIPT_Open, NULL, false);
}